

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  bool bVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  float *output;
  byte *pbVar11;
  stbi_uc *psVar12;
  ulong uVar13;
  byte *pbVar14;
  long lVar15;
  int c;
  int b;
  uint uVar16;
  float *output_00;
  uint a;
  ulong uVar17;
  long in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  stbi_uc *local_4a8;
  float *local_490;
  stbi_uc *local_488;
  long local_480;
  char *local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  stbi_uc local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  iVar7 = req_comp;
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar1 = false;
      do {
        auVar18[0] = -(cStack_431 == '3');
        auVar18[1] = -(cStack_430 == '2');
        auVar18[2] = -(cStack_42f == '-');
        auVar18[3] = -(cStack_42e == 'b');
        auVar18[4] = -(cStack_42d == 'i');
        auVar18[5] = -(cStack_42c == 't');
        auVar18[6] = -(cStack_42b == '_');
        auVar18[7] = -(cStack_42a == 'r');
        auVar18[8] = -(cStack_429 == 'l');
        auVar18[9] = -(cStack_428 == 'e');
        auVar18[10] = -(cStack_427 == '_');
        auVar18[0xb] = -(cStack_426 == 'r');
        auVar18[0xc] = -(cStack_425 == 'g');
        auVar18[0xd] = -(cStack_424 == 'b');
        auVar18[0xe] = -(cStack_423 == 'e');
        auVar18[0xf] = -(cStack_422 == '\0');
        auVar19[0] = -(local_438 == 'F');
        auVar19[1] = -(cStack_437 == 'O');
        auVar19[2] = -(cStack_436 == 'R');
        auVar19[3] = -(cStack_435 == 'M');
        auVar19[4] = -(cStack_434 == 'A');
        auVar19[5] = -(cStack_433 == 'T');
        auVar19[6] = -(cStack_432 == '=');
        auVar19[7] = -(cStack_431 == '3');
        auVar19[8] = -(cStack_430 == '2');
        auVar19[9] = -(cStack_42f == '-');
        auVar19[10] = -(cStack_42e == 'b');
        auVar19[0xb] = -(cStack_42d == 'i');
        auVar19[0xc] = -(cStack_42c == 't');
        auVar19[0xd] = -(cStack_42b == '_');
        auVar19[0xe] = -(cStack_42a == 'r');
        auVar19[0xf] = -(cStack_429 == 'l');
        auVar19 = auVar19 & auVar18;
        if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
          bVar1 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar1) {
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_448 = &cStack_435;
          uVar9 = strtol(local_448,&local_448,10);
          local_448 = local_448 + 2;
          do {
            pcVar8 = local_448;
            local_448 = pcVar8 + 1;
          } while (pcVar8[-2] == ' ');
          if (((pcVar8[-2] == '+') && (pcVar8[-1] == 'X')) && (*pcVar8 == ' ')) {
            uVar10 = strtol(local_448,(char **)0x0,10);
            b = (int)uVar9;
            if ((b < 0x1000001) && (a = (uint)uVar10, (int)a < 0x1000001)) {
              *x = a;
              *y = b;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              c = 3;
              if (req_comp != 0) {
                c = req_comp;
              }
              iVar6 = stbi__mad4sizes_valid(a,b,c,4,iVar7);
              if (iVar6 != 0) {
                output = (float *)stbi__malloc_mad4(a,b,c,4,iVar7);
                if (output == (float *)0x0) {
LAB_0012a8b2:
                  pcVar8 = "outofmem";
                }
                else {
                  iVar7 = 0;
                  if (a - 0x8000 < 0xffff8008) goto LAB_0012a8c1;
                  if (b < 1) {
                    return output;
                  }
                  uVar13 = 0;
                  local_4a8 = (stbi_uc *)0x0;
                  local_490 = output;
                  while( true ) {
                    sVar2 = stbi__get8(s);
                    sVar3 = stbi__get8(s);
                    sVar4 = stbi__get8(s);
                    if (((sVar2 != '\x02') || (sVar3 != '\x02')) || ((char)sVar4 < '\0')) {
                      local_440 = sVar2;
                      local_43f = sVar3;
                      local_43e = sVar4;
                      local_43d = stbi__get8(s);
                      stbi__hdr_convert(output,&local_440,c);
                      free(local_4a8);
                      iVar7 = 0;
                      iVar6 = 1;
                      do {
                        stbi__getn(s,local_43c,4);
                        stbi__hdr_convert(output + (long)(int)(c * a * iVar7) + (long)(iVar6 * c),
                                          local_43c,c);
                        iVar6 = iVar6 + 1;
                        while ((int)a <= iVar6) {
                          iVar7 = iVar7 + 1;
LAB_0012a8c1:
                          iVar6 = 0;
                          if (b <= iVar7) {
                            return output;
                          }
                        }
                      } while( true );
                    }
                    sVar2 = stbi__get8(s);
                    if (CONCAT11(sVar4,sVar2) != a) break;
                    if ((local_4a8 == (stbi_uc *)0x0) &&
                       (local_4a8 = (stbi_uc *)malloc((ulong)(a * 4)), local_4a8 == (stbi_uc *)0x0))
                    {
                      free(output);
                      goto LAB_0012a8b2;
                    }
                    local_480 = 0;
                    local_488 = local_4a8;
                    do {
                      iVar7 = 0;
                      uVar17 = uVar10 & 0xffffffff;
                      do {
                        pbVar14 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar14) {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar14 = s->img_buffer;
                            goto LAB_0012a674;
                          }
LAB_0012a833:
                          free(output);
                          free(local_4a8);
                          pcVar8 = "corrupt";
                          goto LAB_0012a809;
                        }
LAB_0012a674:
                        pbVar11 = pbVar14 + 1;
                        s->img_buffer = pbVar11;
                        bVar5 = *pbVar14;
                        uVar16 = (uint)bVar5;
                        if (bVar5 < 0x81) {
                          if ((bVar5 == 0) || ((uint)uVar17 < uVar16)) goto LAB_0012a833;
                          lVar15 = 0;
                          do {
                            psVar12 = s->img_buffer;
                            if (psVar12 < s->img_buffer_end) {
LAB_0012a73f:
                              s->img_buffer = psVar12 + 1;
                              sVar2 = *psVar12;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                stbi__refill_buffer(s);
                                psVar12 = s->img_buffer;
                                goto LAB_0012a73f;
                              }
                              sVar2 = '\0';
                            }
                            local_488[lVar15 * 4 + (long)iVar7 * 4] = sVar2;
                            lVar15 = lVar15 + 1;
                          } while (uVar16 != (uint)lVar15);
                          iVar7 = iVar7 + (uint)lVar15;
                        }
                        else {
                          if (pbVar11 < s->img_buffer_end) {
LAB_0012a6ae:
                            s->img_buffer = pbVar11 + 1;
                            bVar5 = *pbVar11;
                          }
                          else {
                            if (s->read_from_callbacks != 0) {
                              stbi__refill_buffer(s);
                              pbVar11 = s->img_buffer;
                              goto LAB_0012a6ae;
                            }
                            bVar5 = 0;
                          }
                          uVar16 = uVar16 & 0x7f;
                          if ((uint)uVar17 < uVar16) goto LAB_0012a833;
                          if ((char)uVar16 != '\0') {
                            lVar15 = 0;
                            do {
                              local_488[lVar15 * 4 + (long)iVar7 * 4] = bVar5;
                              lVar15 = lVar15 + 1;
                            } while (uVar16 != (uint)lVar15);
                            iVar7 = iVar7 + (uint)lVar15;
                          }
                        }
                        uVar17 = (ulong)(a - iVar7);
                      } while (a - iVar7 != 0 && iVar7 <= (int)a);
                      local_480 = local_480 + 1;
                      local_488 = local_488 + 1;
                      psVar12 = local_4a8;
                      output_00 = local_490;
                      uVar17 = uVar10 & 0x7fffffff;
                    } while (local_480 != 4);
                    do {
                      stbi__hdr_convert(output_00,psVar12,c);
                      uVar17 = uVar17 - 1;
                      psVar12 = psVar12 + 4;
                      output_00 = output_00 + c;
                    } while (uVar17 != 0);
                    uVar13 = uVar13 + 1;
                    local_490 = local_490 + (uVar10 & 0xffffffff) * (long)c;
                    if (uVar13 == (uVar9 & 0x7fffffff)) {
                      free(local_4a8);
                      return output;
                    }
                  }
                  free(output);
                  free(local_4a8);
                  pcVar8 = "invalid decoded scanline length";
                }
                goto LAB_0012a809;
              }
            }
            pcVar8 = "too large";
            goto LAB_0012a809;
          }
        }
        pcVar8 = "unsupported data layout";
        goto LAB_0012a809;
      }
    }
    pcVar8 = "unsupported format";
  }
  else {
    pcVar8 = "not HDR";
  }
LAB_0012a809:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar8;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}